

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::ColumnArrowToDuckDBRunEndEncoded
               (Vector *vector,ArrowArray *array,ArrowArrayScanState *array_state,idx_t size,
               ArrowType *arrow_type,int64_t nested_offset,ValidityMask *parent_mask,
               uint64_t parent_offset)

{
  ArrowRunEndEncodingState *run_end_encoding;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this;
  ArrowArray *pAVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var5;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> __ptr;
  _Head_base<0UL,_duckdb::Vector_*,_false> __ptr_00;
  byte bVar6;
  pointer this_00;
  ArrowStructInfo *this_01;
  VectorBuffer *pVVar7;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var8;
  unsigned_long capacity;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> this_02;
  _Head_base<0UL,_duckdb::Vector_*,_false> this_03;
  type pVVar9;
  long lVar10;
  NotImplementedException *this_04;
  PhysicalType type;
  idx_t scan_offset;
  duckdb *this_05;
  string local_c0;
  idx_t local_a0;
  ArrowType *local_98;
  ArrowType *local_90;
  ArrowScanLocalState *local_88;
  int64_t local_80;
  LogicalType local_78;
  ArrowArray *local_60;
  ArrowArray *local_58;
  string local_50;
  
  pAVar1 = *array->children;
  local_60 = array->children[1];
  local_a0 = size;
  local_80 = nested_offset;
  this_00 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
            operator->(&arrow_type->type_info);
  this_01 = ArrowTypeInfo::Cast<duckdb::ArrowStructInfo>(this_00);
  local_98 = ArrowStructInfo::GetChild(this_01,0);
  local_90 = ArrowStructInfo::GetChild(this_01,1);
  local_88 = array_state->state;
  peVar2 = (vector->buffer).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (vector->buffer).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (peVar2 == (element_type *)0x0) goto LAB_0152d4d6;
    local_c0._M_string_length = 0;
    local_c0._M_dataplus._M_p = (pointer)peVar2;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (peVar2 == (element_type *)0x0) goto LAB_0152d4d6;
    local_c0._M_string_length =
         (size_type)
         (vector->buffer).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_c0._M_dataplus._M_p =
         (pointer)(vector->buffer).internal.
                  super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length)->
             _M_use_count + 1;
      }
    }
  }
  pVVar7 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                     ((shared_ptr<duckdb::VectorBuffer,_true> *)&local_c0);
  _Var8._M_head_impl = (VectorAuxiliaryData *)operator_new(0x20);
  peVar4 = (array_state->owned_data).internal.
           super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (array_state->owned_data).internal.
           super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (_Var8._M_head_impl)->type = ARROW_AUXILIARY;
  (_Var8._M_head_impl)->_vptr_VectorAuxiliaryData = (_func_int **)&PTR__ArrowAuxiliaryData_0245a350;
  _Var8._M_head_impl[1]._vptr_VectorAuxiliaryData = (_func_int **)peVar4;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(_Var8._M_head_impl + 1) + 8) = p_Var3;
  _Var5._M_head_impl =
       (pVVar7->aux_data).
       super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
  (pVVar7->aux_data).
  super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
  .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl = _Var8._M_head_impl;
  if (_Var5._M_head_impl != (VectorAuxiliaryData *)0x0) {
    (**(code **)((long)(_Var5._M_head_impl)->_vptr_VectorAuxiliaryData + 8))();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length);
  }
LAB_0152d4d6:
  local_58 = array;
  capacity = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar1->length);
  run_end_encoding = &array_state->run_end_encoding;
  if ((Vector *)
      (array_state->run_end_encoding).run_ends.
      super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false> == (Vector *)0x0) {
    ArrowType::GetDuckType(&local_78,local_98,false);
    this_02.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::Vector_*,_false>)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)&local_c0,&local_78);
    Vector::Vector((Vector *)this_02.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl,
                   (LogicalType *)&local_c0,capacity);
    LogicalType::~LogicalType((LogicalType *)&local_c0);
    __ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (run_end_encoding->run_ends).
         super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
         super__Head_base<0UL,_duckdb::Vector_*,_false>;
    (run_end_encoding->run_ends).
    super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false> =
         this_02.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    if (__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)run_end_encoding,
                 (Vector *)__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
    }
    LogicalType::~LogicalType(&local_78);
    ArrowType::GetDuckType(&local_78,local_90,false);
    this_03._M_head_impl = (Vector *)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)&local_c0,&local_78);
    Vector::Vector(this_03._M_head_impl,(LogicalType *)&local_c0,capacity);
    LogicalType::~LogicalType((LogicalType *)&local_c0);
    this = &(array_state->run_end_encoding).values;
    __ptr_00._M_head_impl =
         (array_state->run_end_encoding).values.
         super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
         super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    (array_state->run_end_encoding).values.
    super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = this_03._M_head_impl;
    if (__ptr_00._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)this,__ptr_00._M_head_impl);
    }
    LogicalType::~LogicalType(&local_78);
    pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    ColumnArrowToDuckDB(pVVar9,pAVar1,array_state,capacity,local_98,-1,(ValidityMask *)0x0,0,false);
    pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert((unsigned_long)parent_mask);
    FlatVector::VerifyFlatVector(pVVar9);
    pAVar1 = local_60;
    GetValidityMask(&pVVar9->validity,local_60,(ArrowScanLocalState *)local_88->chunk_offset,
                    capacity,lVar10,local_80,false);
    ColumnArrowToDuckDB(pVVar9,pAVar1,array_state,capacity,local_90,-1,(ValidityMask *)0x0,0,false);
  }
  lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert((unsigned_long)parent_mask);
  scan_offset = lVar10 + local_58->offset + local_88->chunk_offset;
  if (local_80 != -1) {
    scan_offset = local_58->offset + local_80;
  }
  ArrowType::GetDuckType((LogicalType *)&local_c0,local_98,false);
  bVar6 = local_c0._M_dataplus._M_p._1_1_;
  this_05 = (duckdb *)(ulong)local_c0._M_dataplus._M_p._1_1_;
  LogicalType::~LogicalType((LogicalType *)&local_c0);
  if ((bVar6 == 9) || (bVar6 == 7)) {
    FlattenRunEndsSwitch<int>(vector,run_end_encoding,capacity,scan_offset,local_a0);
  }
  else {
    if (bVar6 != 5) {
      this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Type \'%s\' not implemented for RunEndEncoding","");
      TypeIdToString_abi_cxx11_(&local_50,this_05,type);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this_04,&local_c0,&local_50);
      __cxa_throw(this_04,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    FlattenRunEndsSwitch<short>(vector,run_end_encoding,capacity,scan_offset,local_a0);
  }
  return;
}

Assistant:

static void ColumnArrowToDuckDBRunEndEncoded(Vector &vector, const ArrowArray &array, ArrowArrayScanState &array_state,
                                             idx_t size, const ArrowType &arrow_type, int64_t nested_offset,
                                             ValidityMask *parent_mask, uint64_t parent_offset) {
	// Scan the 'run_ends' array
	D_ASSERT(array.n_children == 2);
	auto &run_ends_array = *array.children[0];
	auto &values_array = *array.children[1];

	auto &struct_info = arrow_type.GetTypeInfo<ArrowStructInfo>();
	auto &run_ends_type = struct_info.GetChild(0);
	auto &values_type = struct_info.GetChild(1);
	D_ASSERT(vector.GetType() == values_type.GetDuckType());

	auto &scan_state = array_state.state;
	if (vector.GetBuffer()) {
		vector.GetBuffer()->SetAuxiliaryData(make_uniq<ArrowAuxiliaryData>(array_state.owned_data));
	}

	D_ASSERT(run_ends_array.length == values_array.length);
	auto compressed_size = NumericCast<idx_t>(run_ends_array.length);
	// Create a vector for the run ends and the values
	auto &run_end_encoding = array_state.RunEndEncoding();
	if (!run_end_encoding.run_ends) {
		// The run ends and values have not been scanned yet for this array
		D_ASSERT(!run_end_encoding.values);
		run_end_encoding.run_ends = make_uniq<Vector>(run_ends_type.GetDuckType(), compressed_size);
		run_end_encoding.values = make_uniq<Vector>(values_type.GetDuckType(), compressed_size);

		ColumnArrowToDuckDB(*run_end_encoding.run_ends, run_ends_array, array_state, compressed_size, run_ends_type);
		auto &values = *run_end_encoding.values;
		SetValidityMask(values, values_array, scan_state, compressed_size, NumericCast<int64_t>(parent_offset),
		                nested_offset);
		ColumnArrowToDuckDB(values, values_array, array_state, compressed_size, values_type);
	}

	idx_t scan_offset = GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset), scan_state, nested_offset);
	auto physical_type = run_ends_type.GetDuckType().InternalType();
	switch (physical_type) {
	case PhysicalType::INT16:
		FlattenRunEndsSwitch<int16_t>(vector, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT32:
		FlattenRunEndsSwitch<int32_t>(vector, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT64:
		FlattenRunEndsSwitch<int32_t>(vector, run_end_encoding, compressed_size, scan_offset, size);
		break;
	default:
		throw NotImplementedException("Type '%s' not implemented for RunEndEncoding", TypeIdToString(physical_type));
	}
}